

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_select_cipher
              (ptls_key_schedule_t *sched,ptls_cipher_suite_t *cs,int reset,ptls_iovec_t reset_ikm)

{
  int iVar1;
  anon_struct_24_3_de22c3e4 *paVar2;
  size_t sStack_40;
  int ret;
  size_t i;
  size_t found_slot;
  int reset_local;
  ptls_cipher_suite_t *cs_local;
  ptls_key_schedule_t *sched_local;
  ptls_iovec_t reset_ikm_local;
  
  i = 0xffffffffffffffff;
  if (sched->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x540,
                  "int key_schedule_select_cipher(ptls_key_schedule_t *, ptls_cipher_suite_t *, int, ptls_iovec_t)"
                 );
  }
  for (sStack_40 = 0; sStack_40 != sched->num_hashes; sStack_40 = sStack_40 + 1) {
    if (sched->hashes[sStack_40].algo == cs->hash) {
      if (i != 0xffffffffffffffff) {
        __assert_fail("found_slot == SIZE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x545,
                      "int key_schedule_select_cipher(ptls_key_schedule_t *, ptls_cipher_suite_t *, int, ptls_iovec_t)"
                     );
      }
      i = sStack_40;
    }
    else {
      (*(sched->hashes[sStack_40].ctx)->final)
                (sched->hashes[sStack_40].ctx,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      if (sched->hashes[sStack_40].ctx_outer != (ptls_hash_context_t *)0x0) {
        (*(sched->hashes[sStack_40].ctx_outer)->final)
                  (sched->hashes[sStack_40].ctx_outer,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
      }
    }
  }
  found_slot._4_4_ = reset;
  if (i != 0) {
    paVar2 = sched->hashes + i;
    sched->hashes[0].algo = paVar2->algo;
    sched->hashes[0].ctx = paVar2->ctx;
    sched->hashes[0].ctx_outer = paVar2->ctx_outer;
    found_slot._4_4_ = 1;
  }
  sched->num_hashes = 1;
  if (found_slot._4_4_ != 0) {
    sched->generation = sched->generation - 1;
    memset(sched->secret,0,0x40);
    iVar1 = key_schedule_extract(sched,reset_ikm);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int key_schedule_select_cipher(ptls_key_schedule_t *sched, ptls_cipher_suite_t *cs, int reset, ptls_iovec_t reset_ikm)
{
    size_t found_slot = SIZE_MAX, i;
    int ret;

    assert(sched->generation == 1);

    /* find the one, while freeing others */
    for (i = 0; i != sched->num_hashes; ++i) {
        if (sched->hashes[i].algo == cs->hash) {
            assert(found_slot == SIZE_MAX);
            found_slot = i;
        } else {
            sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
            if (sched->hashes[i].ctx_outer != NULL)
                sched->hashes[i].ctx_outer->final(sched->hashes[i].ctx_outer, NULL, PTLS_HASH_FINAL_MODE_FREE);
        }
    }
    if (found_slot != 0) {
        sched->hashes[0] = sched->hashes[found_slot];
        reset = 1;
    }
    sched->num_hashes = 1;

    /* recalculate the hash if a different hash as been selected than the one we used for calculating the early secrets */
    if (reset) {
        --sched->generation;
        memset(sched->secret, 0, sizeof(sched->secret));
        if ((ret = key_schedule_extract(sched, reset_ikm)) != 0)
            goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}